

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_collider.cpp
# Opt level: O2

void __thiscall
embree::avx::BVHNColliderUserGeom<8>::processLeaf
          (BVHNColliderUserGeom<8> *this,NodeRef node0,NodeRef node1)

{
  undefined1 auVar1 [16];
  Collision CVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  size_t j;
  long lVar6;
  size_t i;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Collision collisions [16];
  
  lVar4 = 0;
  for (lVar7 = 0; lVar7 != (ulong)((uint)node0.ptr & 0xf) - 8; lVar7 = lVar7 + 1) {
    for (lVar6 = 0; (ulong)((uint)node1.ptr & 0xf) - 8 != lVar6; lVar6 = lVar6 + 1) {
      auVar8._8_8_ = 0;
      auVar8._0_8_ = *(ulong *)((node0.ptr & 0xfffffffffffffff0) + lVar7 * 8);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = *(ulong *)((node1.ptr & 0xfffffffffffffff0) + lVar6 * 8);
      auVar1 = vpcmpeqd_avx(auVar8,auVar9);
      auVar1 = vpmovsxdq_avx(auVar1);
      uVar3 = vmovmskpd_avx(auVar1);
      if ((((uVar3 & 2) == 0) || ((uVar3 & 1) == 0)) ||
         (lVar5 = lVar4,
         (this->super_BVHNCollider<8>).scene0 != (this->super_BVHNCollider<8>).scene1)) {
        lVar5 = lVar4 + 1;
        CVar2 = (Collision)vpunpcklqdq_avx(auVar8,auVar9);
        collisions[lVar4] = CVar2;
        if (lVar5 == 0x10) {
          (*(this->super_BVHNCollider<8>).callback)
                    ((this->super_BVHNCollider<8>).userPtr,(RTCCollision *)collisions,0x10);
          lVar5 = 0;
        }
      }
      lVar4 = lVar5;
    }
  }
  if (lVar4 != 0) {
    (*(this->super_BVHNCollider<8>).callback)
              ((this->super_BVHNCollider<8>).userPtr,(RTCCollision *)collisions,(uint)lVar4);
  }
  return;
}

Assistant:

__forceinline void BVHNColliderUserGeom<N>::processLeaf(NodeRef node0, NodeRef node1)
    {
      Collision collisions[16];
      size_t num_collisions = 0;

      size_t N0; Object* leaf0 = (Object*) node0.leaf(N0);
      size_t N1; Object* leaf1 = (Object*) node1.leaf(N1);
      for (size_t i=0; i<N0; i++) {
        for (size_t j=0; j<N1; j++) {
          const unsigned geomID0 = leaf0[i].geomID();
          const unsigned primID0 = leaf0[i].primID();
          const unsigned geomID1 = leaf1[j].geomID();
          const unsigned primID1 = leaf1[j].primID();
          if (this->scene0 == this->scene1 && geomID0 == geomID1 && primID0 == primID1) continue;
          collisions[num_collisions++] = Collision(geomID0,primID0,geomID1,primID1);
          if (num_collisions == 16) {
            this->callback(this->userPtr,(RTCCollision*)&collisions,num_collisions);
            num_collisions = 0;
          }
        }
      }
      if (num_collisions)
        this->callback(this->userPtr,(RTCCollision*)&collisions,num_collisions);
    }